

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiQuaternion __thiscall
Assimp::FBX::FBXConverter::EulerToQuaternion(FBXConverter *this,aiVector3D *rot,RotOrder order)

{
  aiMatrix3x3t<float> local_90;
  undefined1 local_6c [8];
  aiMatrix4x4 m;
  RotOrder order_local;
  aiVector3D *rot_local;
  FBXConverter *this_local;
  
  m.d3 = (float)order;
  unique0x10000080 = rot;
  aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)local_6c);
  GetRotationMatrix(this,(RotOrder)m.d3,stack0xffffffffffffffd8,(aiMatrix4x4t<float> *)local_6c);
  aiMatrix3x3t<float>::aiMatrix3x3t(&local_90,(aiMatrix4x4t<float> *)local_6c);
  aiQuaterniont<float>::aiQuaterniont((aiQuaterniont<float> *)&this_local,&local_90);
  return _this_local;
}

Assistant:

aiQuaternion FBXConverter::EulerToQuaternion(const aiVector3D& rot, Model::RotOrder order)
        {
            aiMatrix4x4 m;
            GetRotationMatrix(order, rot, m);

            return aiQuaternion(aiMatrix3x3(m));
        }